

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

void __thiscall crnd::crn_unpacker::crn_unpacker(crn_unpacker *this)

{
  static_huffman_data_model *local_58;
  static_huffman_data_model *local_28;
  crn_unpacker *this_local;
  
  this->m_magic = 0x1ef9cabd;
  this->m_pData = (uint8 *)0x0;
  this->m_data_size = 0;
  this->m_pHeader = (crn_header *)0x0;
  symbol_codec::symbol_codec(&this->m_codec);
  static_huffman_data_model::static_huffman_data_model(&this->m_reference_encoding_dm);
  local_28 = this->m_endpoint_delta_dm;
  do {
    static_huffman_data_model::static_huffman_data_model(local_28);
    local_28 = local_28 + 1;
  } while (local_28 != this->m_selector_delta_dm);
  local_58 = this->m_selector_delta_dm;
  do {
    static_huffman_data_model::static_huffman_data_model(local_58);
    local_58 = local_58 + 1;
  } while (local_58 != (static_huffman_data_model *)&this->m_color_endpoints);
  vector<unsigned_int>::vector(&this->m_color_endpoints);
  vector<unsigned_int>::vector(&this->m_color_selectors);
  vector<unsigned_short>::vector(&this->m_alpha_endpoints);
  vector<unsigned_short>::vector(&this->m_alpha_selectors);
  vector<crnd::crn_unpacker::block_buffer_element>::vector(&this->m_block_buffer);
  return;
}

Assistant:

inline crn_unpacker() :
            m_magic(cMagicValue),
            m_pData(NULL),
            m_data_size(0),
            m_pHeader(NULL)
        {
        }